

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_stream_parser.cc
# Opt level: O3

Status * __thiscall
google::protobuf::util::converter::JsonStreamParser::FinishParse
          (Status *__return_storage_ptr__,JsonStreamParser *this)

{
  size_type sVar1;
  pointer pcVar2;
  size_t sVar3;
  char *pcVar4;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var5;
  bool bVar6;
  int iVar7;
  pointer __p;
  long lVar8;
  StringPiece message;
  StringPiece message_00;
  StringPiece local_80;
  char local_68 [24];
  Status *local_50;
  StringPiece local_48;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  
  sVar1 = (this->leftover_)._M_string_length;
  if ((this->stack_).c.
      super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      (this->stack_).c.
      super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur && sVar1 == 0) {
    Status::Status(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  local_38._M_head_impl = (string *)0x0;
  bVar6 = protobuf::internal::IsStructurallyValidUTF8((this->leftover_)._M_dataplus._M_p,(int)sVar1)
  ;
  if (this->coerce_to_utf8_ == true && !bVar6) {
    __p = (pointer)operator_new(0x20);
    (__p->_M_dataplus)._M_p = (pointer)&__p->field_2;
    __p->_M_string_length = 0;
    (__p->field_2)._M_local_buf[0] = '\0';
    std::
    __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reset((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_38,__p);
    std::__cxx11::string::reserve((ulong)local_38._M_head_impl);
    local_48.ptr_ = (this->leftover_)._M_dataplus._M_p;
    local_48.length_ = (this->leftover_)._M_string_length;
    if (local_48.length_ < 0) {
      StringPiece::LogFatalSizeTooBig(local_48.length_,"size_t to int conversion");
LAB_0030dc77:
      _Var5._M_head_impl = local_38._M_head_impl;
      local_50 = __return_storage_ptr__;
      do {
        iVar7 = protobuf::internal::UTF8SpnStructurallyValid(&local_48);
        local_80 = StringPiece::substr(&local_48,0,(long)iVar7);
        StrAppend(_Var5._M_head_impl,(AlphaNum *)&local_80);
        __return_storage_ptr__ = local_50;
        if (local_48.length_ == iVar7) break;
        local_80.ptr_ = (this->utf8_replacement_character_)._M_dataplus._M_p;
        local_80.length_ = (this->utf8_replacement_character_)._M_string_length;
        StrAppend(_Var5._M_head_impl,(AlphaNum *)&local_80);
        lVar8 = (long)(iVar7 + 1);
        if (local_48.length_ < lVar8) {
          __assert_fail("length_ >= n",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/stubs/stringpiece.h"
                        ,0x11b,
                        "void google::protobuf::StringPiece::remove_prefix(stringpiece_ssize_type)")
          ;
        }
        local_48.ptr_ = local_48.ptr_ + lVar8;
        local_48.length_ = local_48.length_ - lVar8;
        __return_storage_ptr__ = local_50;
      } while (local_48.length_ != 0);
    }
    else if (local_48.length_ != 0) goto LAB_0030dc77;
    pcVar4 = ((local_38._M_head_impl)->_M_dataplus)._M_p;
    sVar3 = (local_38._M_head_impl)->_M_string_length;
    if ((long)sVar3 < 0) {
      StringPiece::LogFatalSizeTooBig(sVar3,"size_t to int conversion");
    }
    (this->json_).ptr_ = pcVar4;
    (this->json_).length_ = sVar3;
    (this->p_).ptr_ = (this->json_).ptr_;
    (this->p_).length_ = (this->json_).length_;
  }
  else {
    pcVar2 = (this->leftover_)._M_dataplus._M_p;
    sVar3 = (this->leftover_)._M_string_length;
    if ((long)sVar3 < 0) {
      StringPiece::LogFatalSizeTooBig(sVar3,"size_t to int conversion");
    }
    (this->json_).ptr_ = pcVar2;
    (this->json_).length_ = sVar3;
    (this->p_).ptr_ = (this->json_).ptr_;
    (this->p_).length_ = (this->json_).length_;
    if (!bVar6) {
      message.length_ = 0x22;
      message.ptr_ = "Encountered non UTF-8 code points.";
      ReportFailure(__return_storage_ptr__,this,message);
      goto LAB_0030dd5b;
    }
  }
  this->finishing_ = true;
  RunParser(__return_storage_ptr__,this);
  if ((__return_storage_ptr__->error_code_ == OK) && (SkipWhitespace(this), (this->p_).length_ != 0)
     ) {
    message_00.length_ = 0x27;
    message_00.ptr_ = "Parsing terminated before end of input.";
    ReportFailure((Status *)&local_80,this,message_00);
    Status::operator=(__return_storage_ptr__,(Status *)&local_80);
    if ((char *)local_80.length_ != local_68) {
      operator_delete((void *)local_80.length_);
    }
  }
LAB_0030dd5b:
  _Var5._M_head_impl = local_38._M_head_impl;
  if (local_38._M_head_impl != (string *)0x0) {
    pcVar2 = ((local_38._M_head_impl)->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &(local_38._M_head_impl)->field_2) {
      operator_delete(pcVar2);
    }
    operator_delete(_Var5._M_head_impl);
  }
  return __return_storage_ptr__;
}

Assistant:

util::Status JsonStreamParser::FinishParse() {
  // If we do not expect anything and there is nothing left to parse we're all
  // done.
  if (stack_.empty() && leftover_.empty()) {
    return util::Status();
  }

  // Lifetime needs to last until RunParser returns, so keep this variable
  // outside of the coerce_to_utf8 block.
  std::unique_ptr<std::string> scratch;

  bool is_valid_utf8 = internal::IsStructurallyValidUTF8(leftover_);
  if (coerce_to_utf8_ && !is_valid_utf8) {
    scratch.reset(new std::string);
    scratch->reserve(leftover_.size() * utf8_replacement_character_.size());
    ReplaceInvalidCodePoints(leftover_, utf8_replacement_character_,
                             scratch.get());
    p_ = json_ = *scratch;
  } else {
    p_ = json_ = leftover_;
    if (!is_valid_utf8) {
      return ReportFailure("Encountered non UTF-8 code points.");
    }
  }

  // Parse the remainder in finishing mode, which reports errors for things like
  // unterminated strings or unknown tokens that would normally be retried.
  finishing_ = true;
  util::Status result = RunParser();
  if (result.ok()) {
    SkipWhitespace();
    if (!p_.empty()) {
      result = ReportFailure("Parsing terminated before end of input.");
    }
  }
  return result;
}